

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O3

void timer_cb(uv_timer_t *timer)

{
  int iVar1;
  uint64_t uVar2;
  
  if (timer[-1].heap_node[1] == (void *)0x0) {
    __assert_fail("ctx->parent_handle != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/fs-poll.c"
                  ,0xb0,"void timer_cb(uv_timer_t *)");
  }
  if ((void **)*(undefined1 **)((long)timer[-1].heap_node[1] + 0x60) == timer[-1].heap_node + 1) {
    uVar2 = uv_now((uv_loop_t *)timer[-1].repeat);
    timer[-1].timeout = uVar2;
    iVar1 = uv_fs_stat((uv_loop_t *)timer[-1].repeat,(uv_fs_t *)(timer + 1),(char *)(timer + 5),
                       poll_cb);
    if (iVar1 == 0) {
      return;
    }
    abort();
  }
  __assert_fail("ctx->parent_handle->poll_ctx == ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/fs-poll.c"
                ,0xb1,"void timer_cb(uv_timer_t *)");
}

Assistant:

static void timer_cb(uv_timer_t* timer) {
  struct poll_ctx* ctx;

  ctx = container_of(timer, struct poll_ctx, timer_handle);
  assert(ctx->parent_handle != NULL);
  assert(ctx->parent_handle->poll_ctx == ctx);
  ctx->start_time = uv_now(ctx->loop);

  if (uv_fs_stat(ctx->loop, &ctx->fs_req, ctx->path, poll_cb))
    abort();
}